

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,StringTree *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,
          ArrayPtr<const_char> *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,ArrayPtr<const_char> *params_19,
          ArrayPtr<const_char> *params_20,ArrayPtr<const_char> *params_21,
          ArrayPtr<const_char> *params_22,CappedArray<char,_26UL> *params_23,
          ArrayPtr<const_char> *params_24,CappedArray<char,_26UL> *params_25,
          ArrayPtr<const_char> *params_26)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_148;
  StringTree *local_130;
  ArrayPtr<const_char> *local_128;
  ArrayPtr<const_char> *local_120;
  StringTree *local_118;
  ArrayPtr<const_char> *local_110;
  char *local_108;
  size_t sStack_100;
  size_t local_f8;
  size_t sStack_f0;
  char *local_e8;
  char *local_e0;
  size_t sStack_d8;
  size_t local_d0;
  size_t sStack_c8;
  size_t local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  size_t sStack_98;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  size_t sStack_68;
  size_t local_60;
  size_t sStack_58;
  char *local_50;
  undefined8 uStack_48;
  char *local_40;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_108 = (this->text).content.ptr;
  sStack_100 = params->size_;
  local_f8 = params_1->size_;
  sStack_f0 = params_2->size_;
  local_e8 = params_3->ptr;
  local_e0 = (params_4->text).content.ptr;
  sStack_d8 = params_5->size_;
  local_d0 = params_6->size_;
  sStack_c8 = params_7->size_;
  local_c0 = params_8->size_;
  local_b8 = params_9->ptr;
  local_b0 = (params_10->text).content.ptr;
  local_a8 = params_11->ptr;
  local_a0 = (params_12->text).content.ptr;
  sStack_98 = params_13->size_;
  local_90 = params_14->size_;
  sStack_88 = params_15->size_;
  local_80 = params_16->size_;
  sStack_78 = params_17->size_;
  local_70 = params_18->size_;
  sStack_68 = params_19->size_;
  local_60 = params_20->size_;
  sStack_58 = params_21->size_;
  local_50 = params_22->ptr;
  uStack_48 = *(undefined8 *)params_23->content;
  local_40 = params_24->ptr;
  uStack_38 = *(undefined8 *)params_25->content;
  nums._M_len = (size_type)params_10;
  nums._M_array = (iterator)0x1b;
  local_118 = (StringTree *)params_3;
  sVar1 = _::sum((_ *)&local_108,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_108 = (this->text).content.ptr;
  sStack_100 = params->size_;
  local_f8 = params_1->size_;
  sStack_f0 = params_2->size_;
  local_e8 = (char *)0x0;
  local_e0 = (params_4->text).content.ptr;
  sStack_d8 = params_5->size_;
  local_d0 = params_6->size_;
  sStack_c8 = params_7->size_;
  local_c0 = params_8->size_;
  local_b8 = (char *)0x0;
  local_b0 = (params_10->text).content.ptr;
  local_a8 = (char *)0x0;
  local_a0 = (params_12->text).content.ptr;
  sStack_98 = params_13->size_;
  local_90 = params_14->size_;
  sStack_88 = params_15->size_;
  local_80 = params_16->size_;
  sStack_78 = params_17->size_;
  local_70 = params_18->size_;
  sStack_68 = params_19->size_;
  local_60 = params_20->size_;
  sStack_58 = params_21->size_;
  local_50 = params_22->ptr;
  uStack_48 = *(undefined8 *)params_23->content;
  local_40 = params_24->ptr;
  uStack_38 = *(undefined8 *)params_25->content;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x1b;
  local_130 = this;
  local_128 = params;
  local_120 = params_1;
  local_110 = params_2;
  sVar1 = _::sum((_ *)&local_108,nums_00);
  heapString((String *)&local_148,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_148);
  Array<char>::~Array((Array<char> *)&local_148);
  local_f8 = 0;
  sStack_f0 = 0;
  local_108 = (char *)0x0;
  sStack_100 = 0;
  local_e8 = (char *)0x1;
  local_e0 = (char *)0x0;
  sStack_d8 = 0;
  local_d0 = 0;
  sStack_c8 = 0;
  local_c0 = 0;
  local_b8 = (char *)0x1;
  local_b0 = (char *)0x0;
  local_a8 = (char *)0x1;
  local_a0 = (char *)0x0;
  sStack_98 = 0;
  local_90 = 0;
  sStack_88 = 0;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 0;
  sStack_68 = 0;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = (char *)0x0;
  uStack_48 = 0;
  local_40 = (char *)0x0;
  uStack_38 = 0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x1b;
  sVar1 = _::sum((_ *)&local_108,nums_01);
  local_148.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_148.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_148.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_148);
  Array<kj::StringTree::Branch>::~Array(&local_148);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_130,local_128,local_120,
             local_110,local_118,(ArrayPtr<const_char> *)params_4,params_5,params_6,params_7,
             params_8,(StringTree *)params_9,(ArrayPtr<const_char> *)params_10,
             (StringTree *)params_11,(ArrayPtr<const_char> *)params_12,params_13,params_14,params_15
             ,params_16,params_17,params_18,params_19,params_20,params_21,
             (CappedArray<char,_26UL> *)params_22,(ArrayPtr<const_char> *)params_23,
             (CappedArray<char,_26UL> *)params_24,(ArrayPtr<const_char> *)params_25);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}